

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O3

IndexedVectorArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,IndexedVectorArray *u,
          Vector *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt,IndexedVectorArray *ino,IndexedVectorArray *premea)

{
  undefined8 *puVar1;
  pointer pMVar2;
  _Map_pointer ppMVar3;
  _Map_pointer ppMVar4;
  _Elt_pointer pMVar5;
  _Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *p_Var6;
  undefined1 auVar7 [16];
  IndexedVectorArray *this;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *v;
  value_type *__x;
  double *pdVar8;
  long lVar9;
  DenseStorage<double,__1,__1,_1,_0> *pDVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  undefined1 auVar17 [16];
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  Matrix Q;
  Matrix R;
  FixedContactEKFFlexEstimatorIMU estimator;
  assign_op<double,_double> local_5e9;
  Deque *local_5e8;
  Matrix<double,__1,__1,_0,__1,__1> local_5e0;
  IndexedVectorArray *local_5c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_5c0;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_598;
  Matrix<double,__1,__1,_0,__1,__1> local_590;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  FixedContactEKFFlexEstimatorIMU local_558 [1320];
  
  local_5e8 = (Deque *)contactsPositions;
  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
  FixedContactEKFFlexEstimatorIMU(local_558,0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
  stateObservation::KalmanFilterBase::getRmatrixIdentity();
  if (-1 < (local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols | local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows)) {
    local_5c0.m_rhs.m_rows.m_value =
         local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    local_5c0.m_rhs.m_cols.m_value =
         local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
    ;
    local_5c0.m_rhs.m_functor.m_other = 1e-30;
    local_5c0.m_lhs = &local_590;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
              (&local_590,&local_5c0,(assign_op<double,_double> *)&local_5e0);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
    stateObservation::KalmanFilterBase::getQmatrixIdentity();
    if (-1 < (local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols | local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows)) {
      local_5c0.m_rhs.m_rows.m_value =
           local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_5c0.m_rhs.m_cols.m_value =
           local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_5c0.m_rhs.m_functor.m_other = 0.0001;
      local_5c0.m_lhs = &local_5e0;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                (&local_5e0,&local_5c0,&local_5e9);
      auVar7 = _DAT_00107110;
      auVar17 = _DAT_00107100;
      if ((8 < local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) &&
         (8 < local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols)) {
        pdVar8 = local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
                 local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 6 + 7;
        lVar13 = 0;
        lVar14 = 0;
        do {
          lVar15 = 0;
          auVar20 = auVar17;
          do {
            auVar19 = auVar20 ^ auVar7;
            bVar18 = auVar19._4_4_ == -0x80000000 && auVar19._0_4_ < -0x7ffffffd;
            if (bVar18) {
              uVar21 = 0x3e45798ee2308c3a;
              if (lVar13 != lVar15) {
                uVar21 = 0;
              }
              *(undefined8 *)((long)pdVar8 + lVar15 + -8) = uVar21;
            }
            if (bVar18) {
              uVar21 = 0x3e45798ee2308c3a;
              if (lVar13 + -8 != lVar15) {
                uVar21 = 0;
              }
              *(undefined8 *)((long)pdVar8 + lVar15) = uVar21;
            }
            auVar19 = _DAT_00107100;
            lVar9 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 2;
            auVar20._8_8_ = lVar9 + 2;
            lVar15 = lVar15 + 0x10;
          } while (lVar15 != 0x20);
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 8;
          pdVar8 = pdVar8 + local_5e0.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows;
        } while (lVar14 != 3);
        if ((0x11 < local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows) &&
           (0x11 < local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols)) {
          pdVar8 = local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data +
                   local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * 0xf + 0x10;
          lVar13 = 0;
          lVar14 = 0;
          do {
            lVar15 = 0;
            auVar17 = auVar19;
            do {
              auVar20 = auVar17 ^ auVar7;
              bVar18 = auVar20._4_4_ == -0x80000000 && auVar20._0_4_ < -0x7ffffffd;
              if (bVar18) {
                uVar21 = 0x3e45798ee2308c3a;
                if (lVar13 != lVar15) {
                  uVar21 = 0;
                }
                *(undefined8 *)((long)pdVar8 + lVar15 + -8) = uVar21;
              }
              if (bVar18) {
                uVar21 = 0x3e45798ee2308c3a;
                if (lVar13 + -8 != lVar15) {
                  uVar21 = 0;
                }
                *(undefined8 *)((long)pdVar8 + lVar15) = uVar21;
              }
              lVar9 = auVar17._8_8_;
              auVar17._0_8_ = auVar17._0_8_ + 2;
              auVar17._8_8_ = lVar9 + 2;
              lVar15 = lVar15 + 0x10;
            } while (lVar15 != 0x20);
            lVar14 = lVar14 + 1;
            lVar13 = lVar13 + 8;
            pdVar8 = pdVar8 + local_5e0.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
          } while (lVar14 != 3);
          stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
          setFlexibilityCovariance((Matrix *)local_558);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setMeasurementNoiseCovariance((Matrix *)local_558);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setProcessNoiseCovariance((Matrix *)local_558);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setContactsNumber((uint)local_558);
          local_5c8 = __return_storage_ptr__;
          local_598 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh0;
          if (numberOfContacts != 0) {
            lVar13 = 0;
            iVar16 = 0;
            do {
              pMVar2 = (((_Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)&local_5e8->
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        )->_M_impl).super__Vector_impl_data._M_start;
              local_568 = *(undefined8 *)
                           ((long)&(pMVar2->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data + lVar13 + 0x10);
              puVar1 = (undefined8 *)
                       ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               ).m_storage.m_data + lVar13);
              local_578 = *puVar1;
              uStack_570 = puVar1[1];
              stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              setContactPosition(local_558,iVar16,&local_578);
              iVar16 = iVar16 + 1;
              lVar13 = lVar13 + 0x18;
            } while ((ulong)numberOfContacts * 0x18 != lVar13);
          }
          v = local_598;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5c0,local_598);
          stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
          setFlexibilityGuess((Matrix *)local_558);
          this = local_5c8;
          free(local_5c0.m_lhs);
          local_5e8 = &this->v_;
          p_Var6 = &(this->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ;
          (p_Var6->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
          (p_Var6->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
          *(undefined1 (*) [16])
           &(this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node = (undefined1  [16])0x0;
          p_Var6 = &(this->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ;
          (p_Var6->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
          (p_Var6->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size = 0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          this->k_ = 0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          (this->v_).
          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
          std::
          _Deque_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::_M_initialize_map(&local_5e8->
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ,0);
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::setValue(this,(Matrix<double,__1,_1,_0,__1,_1> *)v,y->k_ + -1);
          lVar13 = y->k_;
          lVar15 = lVar13 << 4;
          lVar14 = lVar13;
          do {
            ppMVar3 = (y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node;
            ppMVar4 = (y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node;
            lVar9 = ((long)(y->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(y->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                    ((((ulong)((long)ppMVar3 - (long)ppMVar4) >> 3) - 1) +
                    (ulong)(ppMVar3 == (_Map_pointer)0x0)) * 0x20;
            pMVar5 = (y->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            lVar11 = (long)(y->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar5 >> 4;
            if (lVar13 + lVar11 + lVar9 <= lVar14) {
              free(local_5e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              ~FixedContactEKFFlexEstimatorIMU(local_558);
              return local_5c8;
            }
            if ((lVar9 + lVar11 == 0) || (lVar14 < lVar13)) goto LAB_00102c06;
            lVar9 = ((long)pMVar5 -
                     (long)(y->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar13;
            uVar12 = lVar14 + lVar9;
            if ((long)uVar12 < 0) {
              uVar12 = (long)uVar12 >> 5;
LAB_00102a4b:
              pDVar10 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (ppMVar4[uVar12] + lVar14 + uVar12 * -0x20 + lVar9);
            }
            else {
              if (0x1f < uVar12) {
                uVar12 = uVar12 >> 5;
                goto LAB_00102a4b;
              }
              pDVar10 = (DenseStorage<double,__1,__1,_1,_0> *)
                        ((long)&pMVar5[-lVar13].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + lVar15);
            }
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,_1,_0> *)&local_5c0,pDVar10);
            stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurement
                      ((Matrix *)local_558);
            free(local_5c0.m_lhs);
            ppMVar3 = (u->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node;
            ppMVar4 = (u->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node;
            pMVar5 = (u->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            lVar13 = ((long)(u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar5 >> 4) +
                     ((long)(u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)(u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)ppMVar3 - (long)ppMVar4) >> 3) - 1) +
                     (ulong)(ppMVar3 == (_Map_pointer)0x0)) * 0x20;
            if (((lVar13 == 0) || (lVar9 = u->k_, lVar14 < lVar9)) || (lVar13 + lVar9 <= lVar14)) {
LAB_00102c06:
              __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                            ,0x192,
                            "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                           );
            }
            lVar13 = ((long)pMVar5 -
                      (long)(u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar9;
            uVar12 = lVar14 + lVar13;
            if ((long)uVar12 < 0) {
              uVar12 = (long)uVar12 >> 5;
LAB_00102b0f:
              pDVar10 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (ppMVar4[uVar12] + lVar14 + uVar12 * -0x20 + lVar13);
            }
            else {
              if (0x1f < uVar12) {
                uVar12 = uVar12 >> 5;
                goto LAB_00102b0f;
              }
              pDVar10 = (DenseStorage<double,__1,__1,_1,_0> *)
                        ((long)&pMVar5[-lVar9].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + lVar15);
            }
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,_1,_0> *)&local_5c0,pDVar10);
            stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
            setMeasurementInput((Matrix *)local_558);
            free(local_5c0.m_lhs);
            __x = (value_type *)
                  stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
                  getFlexibilityVector();
            std::
            deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::push_back(local_5e8,__x);
            if (ino != (IndexedVectorArray *)0x0) {
              stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInnovation();
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::setValue(ino,(Matrix<double,__1,_1,_0,__1,_1> *)&local_5c0,lVar14);
              free(local_5c0.m_lhs);
            }
            if (premea != (IndexedVectorArray *)0x0) {
              stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
              getLastPredictedMeasurement();
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::setValue(premea,(Matrix<double,__1,_1,_0,__1,_1> *)&local_5c0,lVar14);
              free(local_5c0.m_lhs);
            }
            lVar14 = lVar14 + 1;
            lVar13 = y->k_;
            lVar15 = lVar15 + 0x10;
          } while( true );
        }
      }
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                   );
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

stateObservation::IndexedVectorArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedVectorArray & y,
            const stateObservation::IndexedVectorArray & u,
            const Vector & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3,Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt,
            IndexedVectorArray * ino,
            IndexedVectorArray * premea)
{

    (void)dt;
        ///Sizes of the states for the state, the measurement, and the input vector

    flexibilityEstimation::FixedContactEKFFlexEstimatorIMU estimator;


    Matrix R(estimator.getEKF().getRmatrixIdentity());
    R=R*1.e-30;

    Matrix Q(estimator.getEKF().getQmatrixIdentity());
    Q=Q*1.e-4;
    Q.block(6,6,3,3)=Matrix3::Identity()*1.e-8;
    Q.block(15,15,3,3)=Matrix3::Identity()*1.e-8;


    estimator.setFlexibilityCovariance(Q);
    estimator.setMeasurementNoiseCovariance(R);
    estimator.setProcessNoiseCovariance(Q);


    estimator.setContactsNumber(numberOfContacts);

    for (unsigned i = 0; i<numberOfContacts ; ++i)
    {
        estimator.setContactPosition(i,contactsPositions[i]);
    }

    ///
    estimator.setFlexibilityGuess(xh0);

    ///the array of the state estimations over time
    stateObservation::IndexedVectorArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (TimeIndex i=y.getFirstIndex();i<y.getNextIndex();++i)
    {
        //std::cout << i << std::endl;

        ///introduction of the measurement
        estimator.setMeasurement(y[i]);

        estimator.setMeasurementInput(u[i]);

        ///get the estimation and give it to the array
        xh.pushBack(estimator.getFlexibilityVector());

        if (ino != 0)
        {
            ino->setValue(estimator.getInnovation(),i);
        }

        if (premea != 0)
        {
            premea->setValue(estimator.getLastPredictedMeasurement(),i);
        }

    }

    return xh;
}